

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

void minimalSwapAndFlipIVar_superFast_lessThen5
               (word *pInOut,int iVar,int nWords,char *pCanonPerm,uint *pCanonPhase)

{
  word *pInOut_00;
  int iVar1;
  int local_50 [2];
  int M [2];
  int DifStart4;
  int DifStartMin;
  int DifStart1;
  int DifStart0;
  int min2;
  int min1;
  uint *pCanonPhase_local;
  char *pCanonPerm_local;
  int nWords_local;
  int iVar_local;
  word *pInOut_local;
  
  M[0] = 0;
  _min2 = pCanonPhase;
  pCanonPhase_local = (uint *)pCanonPerm;
  pCanonPerm_local._0_4_ = nWords;
  pCanonPerm_local._4_4_ = iVar;
  _nWords_local = pInOut;
  local_50[0] = minTemp0_fast(pInOut,iVar,nWords,&DifStartMin);
  local_50[1] = minTemp1_fast(_nWords_local,pCanonPerm_local._4_4_,(int)pCanonPerm_local,&DifStart4)
  ;
  DifStart0 = minTemp2_fast(_nWords_local,pCanonPerm_local._4_4_,local_50[0],local_50[1],
                            (int)pCanonPerm_local,M + 1);
  pInOut_00 = _nWords_local;
  if (DifStartMin == DifStart4) {
    if (M[1] < DifStartMin) {
      DifStart1 = minTemp3_fast(_nWords_local,pCanonPerm_local._4_4_,DifStartMin / 100,M[1] / 100,
                                3 - local_50[0],3 - local_50[1],M);
      if (M[1] < M[0]) {
        arrangeQuoters_superFast_lessThen5
                  (_nWords_local,DifStartMin / 100,local_50[(int)(DifStart1 + 1U & 1)],
                   local_50[DifStart1],3 - local_50[DifStart1],
                   3 - local_50[(int)(DifStart1 + 1U & 1)],pCanonPerm_local._4_4_,
                   (int)pCanonPerm_local,(char *)pCanonPhase_local,_min2);
      }
      else {
        arrangeQuoters_superFast_lessThen5
                  (_nWords_local,DifStartMin / 100,local_50[DifStart0],
                   local_50[(int)(DifStart0 + 1U & 1)],3 - local_50[(int)(DifStart0 + 1U & 1)],
                   3 - local_50[DifStart0],pCanonPerm_local._4_4_,(int)pCanonPerm_local,
                   (char *)pCanonPhase_local,_min2);
      }
    }
    else {
      arrangeQuoters_superFast_lessThen5
                (_nWords_local,M[1] / 100,local_50[DifStart0],local_50[(int)(DifStart0 + 1U & 1)],
                 3 - local_50[(int)(DifStart0 + 1U & 1)],3 - local_50[DifStart0],
                 pCanonPerm_local._4_4_,(int)pCanonPerm_local,(char *)pCanonPhase_local,_min2);
    }
  }
  else if ((M[1] < DifStart4) || (M[1] < DifStartMin)) {
    if (DifStart4 < DifStartMin) {
      iVar1 = luckyMax(M[1] / 100,DifStartMin / 100);
      arrangeQuoters_superFast_lessThen5
                (pInOut_00,iVar1,local_50[0],local_50[1],3 - local_50[1],3 - local_50[0],
                 pCanonPerm_local._4_4_,(int)pCanonPerm_local,(char *)pCanonPhase_local,_min2);
    }
    else {
      iVar1 = luckyMax(M[1] / 100,DifStart4 / 100);
      arrangeQuoters_superFast_lessThen5
                (pInOut_00,iVar1,local_50[1],local_50[0],3 - local_50[0],3 - local_50[1],
                 pCanonPerm_local._4_4_,(int)pCanonPerm_local,(char *)pCanonPhase_local,_min2);
    }
  }
  else {
    arrangeQuoters_superFast_lessThen5
              (_nWords_local,M[1] / 100,local_50[DifStart0],local_50[(int)(DifStart0 + 1U & 1)],
               3 - local_50[(int)(DifStart0 + 1U & 1)],3 - local_50[DifStart0],
               pCanonPerm_local._4_4_,(int)pCanonPerm_local,(char *)pCanonPhase_local,_min2);
  }
  return;
}

Assistant:

void minimalSwapAndFlipIVar_superFast_lessThen5(word* pInOut, int iVar, int nWords, char * pCanonPerm, unsigned* pCanonPhase)
{
    int min1, min2, DifStart0, DifStart1, DifStartMin, DifStart4=0;
    int M[2];   
    M[0] = minTemp0_fast(pInOut, iVar, nWords, &DifStart0); // 0, 3
    M[1] = minTemp1_fast(pInOut, iVar, nWords, &DifStart1); // 1, 2
    min1 = minTemp2_fast(pInOut, iVar, M[0], M[1], nWords, &DifStartMin);
//     printf("\nDifStart0 = %d, DifStart1 = %d, DifStartMin = %d\n",DifStart0, DifStart1, DifStartMin);
//     printf("M[0] = %d, M[1] = %d, min1 = %d\n", M[0], M[1], min1);
    if(DifStart0 != DifStart1)
    {
//         printf("if\n");
        if( DifStartMin>=DifStart1 && DifStartMin>=DifStart0 )
            arrangeQuoters_superFast_lessThen5(pInOut, DifStartMin/100, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, nWords, pCanonPerm, pCanonPhase);
        else if( DifStart0 > DifStart1)
            arrangeQuoters_superFast_lessThen5(pInOut,luckyMax(DifStartMin/100, DifStart0/100), M[0], M[1], 3 - M[1], 3 - M[0], iVar, nWords, pCanonPerm, pCanonPhase);
        else
            arrangeQuoters_superFast_lessThen5(pInOut,luckyMax(DifStartMin/100, DifStart1/100), M[1], M[0], 3 - M[0], 3 - M[1], iVar, nWords, pCanonPerm, pCanonPhase);
    }
    else
    {
//         printf("else\n");
        if(DifStartMin>=DifStart0)
            arrangeQuoters_superFast_lessThen5(pInOut, DifStartMin/100, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, nWords, pCanonPerm, pCanonPhase);
        else
        {
            min2 = minTemp3_fast(pInOut, iVar, DifStart0/100, DifStartMin/100, 3-M[0], 3-M[1], &DifStart4);  // no reuse DifStart1 because DifStart1 = DifStart1=0
//             printf("after minTemp3_fast min2 = %d, DifStart4 = %d\n", min2, DifStart4);
            if(DifStart4>DifStartMin)
                arrangeQuoters_superFast_lessThen5(pInOut, DifStart0/100, M[(min2+1)&1], M[min2], 3 - M[min2], 3 - M[(min2+1)&1], iVar, nWords, pCanonPerm, pCanonPhase);
            else
                arrangeQuoters_superFast_lessThen5(pInOut, DifStart0/100, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, nWords, pCanonPerm, pCanonPhase);
        }
    }
}